

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

void f_cdf_values(int *n_data,int *a,int *b,double *x,double *fx)

{
  double *fx_local;
  double *x_local;
  int *b_local;
  int *a_local;
  int *n_data_local;
  
  if (*n_data < 0) {
    *n_data = 0;
  }
  *n_data = *n_data + 1;
  if (*n_data < 0x15) {
    *a = f_cdf_values::a_vec[*n_data + -1];
    *b = f_cdf_values::b_vec[*n_data + -1];
    *x = f_cdf_values::x_vec[*n_data + -1];
    *fx = f_cdf_values::fx_vec[*n_data + -1];
  }
  else {
    *n_data = 0;
    *a = 0;
    *b = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  return;
}

Assistant:

void f_cdf_values ( int &n_data, int &a, int &b, double &x, double &fx )

//****************************************************************************80
//
//  Purpose:
//
//    F_CDF_VALUES returns some values of the F CDF test function.
//
//  Discussion:
//
//    In Mathematica, the function can be evaluated by:
//
//      Needs["Statistics`ContinuousDistributions`"]
//      dist = FRatioDistribution [ dfn, dfd ]
//      CDF [ dist, x ]
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//  Parameters:
//
//    Input/output, int &N_DATA.  The user sets N_DATA to 0 before the
//    first call.  On each call, the routine increments N_DATA by 1, and
//    returns the corresponding data; when there is no more data, the
//    output value of N_DATA will be 0 again.
//
//    Output, int &A, int &B, the parameters of the function.
//
//    Output, double &X, the argument of the function.
//
//    Output, double &FX, the value of the function.
//
{
# define N_MAX 20

  static int a_vec[N_MAX] = {
    1,
    1,
    5,
    1,
    2,
    4,
    1,
    6,
    8,
    1,
    3,
    6,
    1,
    1,
    1,
    1,
    2,
    3,
    4,
    5 };

  static int b_vec[N_MAX] = {
     1,
     5,
     1,
     5,
    10,
    20,
     5,
     6,
    16,
     5,
    10,
    12,
     5,
     5,
     5,
     5,
     5,
     5,
     5,
     5 };

  static double fx_vec[N_MAX] = {
     0.5000000000000000E+00,
     0.4999714850534485E+00,
     0.4996034370170990E+00,
     0.7496993658293228E+00,
     0.7504656462757382E+00,
     0.7514156325324275E+00,
     0.8999867031372156E+00,
     0.8997127554259699E+00,
     0.9002845660853669E+00,
     0.9500248817817622E+00,
     0.9500574946122442E+00,
     0.9501926400000000E+00,
     0.9750133887312993E+00,
     0.9900022327445249E+00,
     0.9949977837872073E+00,
     0.9989999621122122E+00,
     0.5687988496283079E+00,
     0.5351452100063650E+00,
     0.5143428032407864E+00,
     0.5000000000000000E+00 };

  static double x_vec[N_MAX] = {
      1.00E+00,
      0.528E+00,
      1.89E+00,
      1.69E+00,
      1.60E+00,
      1.47E+00,
      4.06E+00,
      3.05E+00,
      2.09E+00,
      6.61E+00,
      3.71E+00,
      3.00E+00,
     10.01E+00,
     16.26E+00,
     22.78E+00,
     47.18E+00,
      1.00E+00,
      1.00E+00,
      1.00E+00,
      1.00E+00 };

  if ( n_data < 0 )
  {
    n_data = 0;
  }

  n_data = n_data + 1;

  if ( N_MAX < n_data )
  {
    n_data = 0;
    a = 0;
    b = 0;
    x = 0.0;
    fx = 0.0;
  }
  else
  {
    a = a_vec[n_data-1];
    b = b_vec[n_data-1];
    x = x_vec[n_data-1];
    fx = fx_vec[n_data-1];
  }

  return;
# undef N_MAX
}